

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

TSTree * ts_parser_parse_string_encoding
                   (TSParser *self,TSTree *old_tree,char *string,uint32_t length,
                   TSInputEncoding encoding)

{
  TSInput input_00;
  TSTree *pTVar1;
  undefined4 uStack_3c;
  char *local_38;
  TSStringInput input;
  TSInputEncoding encoding_local;
  uint32_t length_local;
  char *string_local;
  TSTree *old_tree_local;
  TSParser *self_local;
  
  input_00._20_4_ = uStack_3c;
  input_00.encoding = encoding;
  input_00.read = ts_string_input_read;
  input_00.payload = &local_38;
  local_38 = string;
  input.string._0_4_ = length;
  input.length = encoding;
  input._12_4_ = length;
  pTVar1 = ts_parser_parse(self,old_tree,input_00);
  return pTVar1;
}

Assistant:

TSTree *ts_parser_parse_string_encoding(TSParser *self, const TSTree *old_tree,
                                        const char *string, uint32_t length, TSInputEncoding encoding) {
  TSStringInput input = {string, length};
  return ts_parser_parse(self, old_tree, (TSInput) {
    &input,
    ts_string_input_read,
    encoding,
  });
}